

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVector.h
# Opt level: O2

void __thiscall
chrono::fea::ChLoadXYZROTnodeBodyBushingPlastic::ComputeForceTorque
          (ChLoadXYZROTnodeBodyBushingPlastic *this,ChFrameMoving<double> *rel_AB,
          ChVector<double> *loc_force,ChVector<double> *loc_torque)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  
  dVar15 = (rel_AB->super_ChFrame<double>).coord.pos.m_data[2];
  dVar1 = (rel_AB->coord_dt).pos.m_data[2];
  dVar7 = (rel_AB->coord_dt).pos.m_data[1];
  dVar2 = (this->plastic_def).m_data[2];
  dVar3 = (this->super_ChLoadXYZROTnodeBodyBushingSpherical).damping.m_data[2];
  dVar8 = (this->super_ChLoadXYZROTnodeBodyBushingSpherical).damping.m_data[1];
  dVar4 = (this->super_ChLoadXYZROTnodeBodyBushingSpherical).stiffness.m_data[2];
  auVar10 = vsubpd_avx(*(undefined1 (*) [16])(rel_AB->super_ChFrame<double>).coord.pos.m_data,
                       *(undefined1 (*) [16])(this->plastic_def).m_data);
  dVar9 = (this->super_ChLoadXYZROTnodeBodyBushingSpherical).stiffness.m_data[1];
  dVar14 = auVar10._0_8_ * (this->super_ChLoadXYZROTnodeBodyBushingSpherical).stiffness.m_data[0] +
           (rel_AB->coord_dt).pos.m_data[0] *
           (this->super_ChLoadXYZROTnodeBodyBushingSpherical).damping.m_data[0];
  loc_force->m_data[0] = dVar14;
  loc_force->m_data[1] = auVar10._8_8_ * dVar9 + dVar7 * dVar8;
  loc_force->m_data[2] = (dVar15 - dVar2) * dVar4 + dVar1 * dVar3;
  dVar15 = (this->yield).m_data[0];
  if (dVar15 < dVar14) {
    loc_force->m_data[0] = dVar15;
    (this->plastic_def).m_data[0] =
         (rel_AB->super_ChFrame<double>).coord.pos.m_data[0] -
         dVar15 / (this->super_ChLoadXYZROTnodeBodyBushingSpherical).stiffness.m_data[0];
    dVar14 = loc_force->m_data[0];
    dVar15 = (this->yield).m_data[0];
  }
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar15;
  auVar10._8_8_ = 0x8000000000000000;
  auVar10._0_8_ = 0x8000000000000000;
  auVar10 = vxorpd_avx512vl(auVar11,auVar10);
  if (dVar14 < auVar10._0_8_) {
    loc_force->m_data[0] = auVar10._0_8_;
    (this->plastic_def).m_data[0] =
         dVar15 / (this->super_ChLoadXYZROTnodeBodyBushingSpherical).stiffness.m_data[0] +
         (rel_AB->super_ChFrame<double>).coord.pos.m_data[0];
  }
  dVar1 = loc_force->m_data[1];
  dVar15 = (this->yield).m_data[1];
  if (dVar15 < dVar1) {
    loc_force->m_data[1] = dVar15;
    (this->plastic_def).m_data[1] =
         (rel_AB->super_ChFrame<double>).coord.pos.m_data[1] -
         dVar15 / (this->super_ChLoadXYZROTnodeBodyBushingSpherical).stiffness.m_data[1];
    dVar1 = loc_force->m_data[1];
    dVar15 = (this->yield).m_data[1];
  }
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar15;
  auVar5._8_8_ = 0x8000000000000000;
  auVar5._0_8_ = 0x8000000000000000;
  auVar10 = vxorpd_avx512vl(auVar12,auVar5);
  if (dVar1 < auVar10._0_8_) {
    loc_force->m_data[1] = auVar10._0_8_;
    (this->plastic_def).m_data[1] =
         dVar15 / (this->super_ChLoadXYZROTnodeBodyBushingSpherical).stiffness.m_data[1] +
         (rel_AB->super_ChFrame<double>).coord.pos.m_data[1];
  }
  dVar15 = loc_force->m_data[2];
  dVar1 = (this->yield).m_data[2];
  if (dVar1 < dVar15) {
    loc_force->m_data[2] = dVar1;
    (this->plastic_def).m_data[2] =
         (rel_AB->super_ChFrame<double>).coord.pos.m_data[2] -
         dVar1 / (this->super_ChLoadXYZROTnodeBodyBushingSpherical).stiffness.m_data[2];
    dVar15 = loc_force->m_data[2];
    dVar1 = (this->yield).m_data[2];
  }
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar1;
  auVar6._8_8_ = 0x8000000000000000;
  auVar6._0_8_ = 0x8000000000000000;
  auVar10 = vxorpd_avx512vl(auVar13,auVar6);
  if (dVar15 < auVar10._0_8_) {
    loc_force->m_data[2] = auVar10._0_8_;
    (this->plastic_def).m_data[2] =
         dVar1 / (this->super_ChLoadXYZROTnodeBodyBushingSpherical).stiffness.m_data[2] +
         (rel_AB->super_ChFrame<double>).coord.pos.m_data[2];
  }
  if (loc_torque != (ChVector<double> *)&VNULL) {
    loc_torque->m_data[0] = VNULL;
    loc_torque->m_data[1] = DAT_011dd3e0;
    loc_torque->m_data[2] = DAT_011dd3e8;
  }
  return;
}

Assistant:

inline ChVector<Real> ChVector<Real>::operator-(const ChVector<Real>& other) const {
    ChVector<Real> v;

    v.m_data[0] = m_data[0] - other.m_data[0];
    v.m_data[1] = m_data[1] - other.m_data[1];
    v.m_data[2] = m_data[2] - other.m_data[2];

    return v;
}